

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<double>::ComputeWeightsLocal
          (TPZDohrSubstructCondense<double> *this,TPZFMatrix<double> *StiffnessDiagLocal)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  uint uVar4;
  mapped_type *pmVar5;
  ulong newRows;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  key_type local_38;
  
  local_38.first = ExternalFirst;
  local_38.second = Submesh;
  pmVar5 = std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](&this->fPermutationsScatter,&local_38);
  iVar1 = this->fNumExternalEquations;
  newRows = (ulong)iVar1;
  if ((long)newRows < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      if (((StiffnessDiagLocal->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar8) ||
         ((StiffnessDiagLocal->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (this->fWeights).super_TPZVec<double>.fStore[pmVar5->fStore[uVar8]] =
           (this->fWeights).super_TPZVec<double>.fStore[pmVar5->fStore[uVar8]] /
           StiffnessDiagLocal->fElem[uVar8];
      uVar8 = uVar8 + 1;
    } while (newRows != uVar8);
  }
  uVar4 = this->fNEquations;
  if ((int)uVar8 < (int)uVar4) {
    piVar2 = pmVar5->fStore;
    pdVar3 = (this->fWeights).super_TPZVec<double>.fStore;
    uVar8 = uVar8 & 0xffffffff;
    do {
      pdVar3[piVar2[uVar8]] = 1.0;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  local_38.first = ExternalFirst;
  local_38.second = Submesh;
  pmVar5 = std::
           map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
           ::operator[](&this->fPermutationsScatter,&local_38);
  uVar4 = (uint)(this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  TPZFMatrix<double>::Resize(&this->fPhiC_Weighted_Condensed,newRows,(long)(int)uVar4);
  if (0 < iVar1) {
    uVar8 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          lVar6 = (long)pmVar5->fStore[uVar8];
          if (((lVar6 < 0) ||
              ((this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6)) ||
             ((this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
               (long)uVar8) ||
             ((this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
              (long)uVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC_Weighted_Condensed).fElem
          [(this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7
           + uVar8] = (this->fPhiC).fElem
                      [(this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7 +
                       lVar6] * (this->fWeights).super_TPZVec<double>.fStore[pmVar5->fStore[uVar8]];
          uVar7 = uVar7 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != newRows);
  }
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	//fWeights.Fill(1.);
	TPZVec<int> &scatter = ScatterVec(ExternalFirst, Submesh);
	int neqs = fNumExternalEquations;
	for (i=0;i<neqs;i++) {
		fWeights[scatter[i]] = fWeights[scatter[i]] / StiffnessDiagLocal(i,0);
	}
	for(; i<fNEquations; i++)
	{
		fWeights[scatter[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	TPZVec<int> &gather = GatherVec(Submesh, ExternalFirst);
	int c,nc = fPhiC.Cols();
	fPhiC_Weighted_Condensed.Resize(neqs,nc);
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			fPhiC_Weighted_Condensed(i,c) = fPhiC(gather[i],c)*fWeights[gather[i]];
		}
	}
}